

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O2

void object_see(player *p,object *obj)

{
  ushort uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  loc grid;
  loc grid_00;
  _Bool _Var4;
  object *obj_00;
  
  obj_00 = p->cave->objects[obj->oidx];
  wVar2 = (obj->grid).x;
  wVar3 = (obj->grid).y;
  grid_00 = obj->grid;
  if (obj_00 == (object *)0x0) {
    if (obj->known != (object *)0x0) {
      __assert_fail("! obj->known",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                    ,0x3c9,"void object_see(struct player *, struct object *)");
    }
    obj_00 = object_new();
    obj->known = obj_00;
    object_set_base_known(p,obj);
    uVar1 = obj->oidx;
    p->cave->objects[uVar1] = obj_00;
    obj_00->oidx = uVar1;
    if (obj->held_m_idx == 0) goto LAB_0019a7c2;
  }
  else {
    if (obj_00 != obj->known) {
      __assert_fail("known_obj == obj->known",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-knowledge.c"
                    ,0x3dc,"void object_see(struct player *, struct object *)");
    }
    grid = obj_00->grid;
    if (obj_00->kind == obj->kind) {
      obj_00->number = obj->number;
    }
    else {
      object_set_base_known(p,obj);
    }
    if ((obj->held_m_idx == 0) &&
       (_Var4 = square_holds_object((chunk_conflict *)p->cave,grid_00,obj_00), !_Var4)) {
      _Var4 = loc_is_zero((loc_conflict)grid);
      if ((!_Var4) && (_Var4 = square_holds_object((chunk_conflict *)p->cave,grid,obj_00), _Var4)) {
        square_excise_object((chunk_conflict *)p->cave,grid,obj_00);
      }
LAB_0019a7c2:
      (obj_00->grid).x = wVar2;
      (obj_00->grid).y = wVar3;
      pile_insert_end(&p->cave->squares[wVar3][wVar2].obj,obj_00);
      return;
    }
  }
  return;
}

Assistant:

void object_see(struct player *p, struct object *obj)
{
	struct object *known_obj = p->cave->objects[obj->oidx];
	struct loc grid = obj->grid;

	/* Make new known objects, fully know sensed ones, relocate old ones */
	if (known_obj == NULL) {
		/* Make a new one */
		struct object *new_obj;

		assert(! obj->known);
		new_obj = object_new();
		obj->known = new_obj;
		object_set_base_known(p, obj);

		/* List the known object */
		p->cave->objects[obj->oidx] = new_obj;
		new_obj->oidx = obj->oidx;

		/* If monster held, we're done */
		if (obj->held_m_idx) return;

		/* Attach it to the current floor pile */
		new_obj->grid = grid;
		pile_insert_end(&p->cave->squares[grid.y][grid.x].obj, new_obj);
	} else {
		struct loc old = known_obj->grid;

		/* Make sure knowledge is correct */
		assert(known_obj == obj->known);

		if (known_obj->kind != obj->kind) {
			/* Copy over actual details */
			object_set_base_known(p, obj);
		} else {
			known_obj->number = obj->number;
		}

		/* If monster held, we're done */
		if (obj->held_m_idx) return;

		/* Attach it to the current floor pile if necessary */
		if (! square_holds_object(p->cave, grid, known_obj)) {
			/* Detach from any old pile */
			if (!loc_is_zero(old) && square_holds_object(p->cave, old, known_obj)) {
				square_excise_object(p->cave, old, known_obj);
			}

			known_obj->grid = grid;
			pile_insert_end(&p->cave->squares[grid.y][grid.x].obj, known_obj);
		}
	}
}